

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore_adf.cc
# Opt level: O2

base_learner * cb_explore_adf_setup(options_i *options,vw *all)

{
  bool bVar1;
  int iVar2;
  option_group_definition *poVar3;
  typed_option<float> *ptVar4;
  ostream *poVar5;
  base_learner *l;
  multi_learner *base;
  multi_learner *pmVar6;
  learner<CB_EXPLORE_ADF::cb_explore_adf,_std::vector<example_*,_std::allocator<example_*>_>_>
  *plVar7;
  long lVar8;
  undefined **ppuVar9;
  label_parser *plVar10;
  size_t ws;
  byte bVar11;
  bool regcb;
  bool softmax;
  bool cb_explore_adf_option;
  free_ptr<CB_EXPLORE_ADF::cb_explore_adf> data;
  allocator local_fa2;
  allocator local_fa1;
  allocator local_fa0;
  allocator local_f9f;
  allocator local_f9e;
  allocator local_f9d;
  allocator local_f9c;
  allocator local_f9b;
  allocator local_f9a;
  allocator local_f99;
  allocator local_f98;
  allocator local_f97;
  allocator local_f96;
  allocator local_f95;
  allocator local_f94;
  allocator local_f93;
  allocator local_f92;
  allocator local_f91;
  allocator local_f90;
  allocator local_f8f;
  allocator local_f8e;
  allocator local_f8d;
  allocator local_f8c;
  allocator local_f8b;
  allocator local_f8a;
  allocator local_f89;
  allocator local_f88;
  allocator local_f87;
  allocator local_f86;
  allocator local_f85;
  allocator local_f84;
  allocator local_f83;
  allocator local_f82;
  allocator local_f81;
  undefined1 local_f80 [112];
  bool local_f10;
  string type_string;
  undefined1 local_ec0 [112];
  bool local_e50;
  string local_e20 [32];
  string local_e00;
  string local_de0 [32];
  string local_dc0;
  string local_da0 [32];
  string local_d80;
  string local_d60 [32];
  string local_d40;
  string local_d20 [32];
  string local_d00;
  string local_ce0 [32];
  string local_cc0;
  string local_ca0 [32];
  string local_c80;
  string local_c60 [32];
  string local_c40;
  string local_c20 [32];
  string local_c00;
  string local_be0 [32];
  string local_bc0;
  string local_ba0 [32];
  string local_b80;
  string local_b60 [32];
  string local_b40;
  string local_b20 [32];
  string local_b00;
  string local_ae0 [32];
  string local_ac0;
  string local_aa0 [32];
  string local_a80;
  string local_a60 [32];
  string local_a40;
  string local_a20 [32];
  string local_a00;
  string local_9e0;
  option_group_definition new_options;
  undefined1 local_988 [112];
  bool local_918;
  undefined1 local_8e8 [112];
  bool local_878;
  undefined1 local_848 [112];
  bool local_7d8;
  undefined1 local_7a8 [112];
  bool local_738;
  undefined1 local_708 [112];
  bool local_698;
  undefined1 local_668 [112];
  bool local_5f8;
  undefined1 local_5c8 [112];
  bool local_558;
  undefined1 local_528 [112];
  bool local_4b8;
  undefined1 local_488 [112];
  bool local_418;
  undefined1 local_3e8 [112];
  bool local_378;
  typed_option<float> local_348;
  typed_option<float> local_2a8;
  typed_option<float> local_208;
  typed_option<float> local_168;
  typed_option<float> local_c8;
  
  bVar11 = 0;
  scoped_calloc_or_throw<CB_EXPLORE_ADF::cb_explore_adf>();
  cb_explore_adf_option = false;
  softmax = false;
  regcb = false;
  std::__cxx11::string::string((string *)&type_string,"mtr",(allocator *)local_f80);
  std::__cxx11::string::string
            ((string *)&local_9e0,"Contextual Bandit Exploration with Action Dependent Features",
             (allocator *)local_f80);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_9e0);
  std::__cxx11::string::~string((string *)&local_9e0);
  std::__cxx11::string::string((string *)&local_a00,"cb_explore_adf",&local_f81);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_f80,&local_a00,&cb_explore_adf_option);
  local_f10 = true;
  std::__cxx11::string::string
            (local_a20,
             "Online explore-exploit for a contextual bandit problem with multiline action dependent features"
             ,&local_f82);
  std::__cxx11::string::_M_assign((string *)(local_f80 + 0x30));
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (&new_options,(typed_option<bool> *)local_f80);
  std::__cxx11::string::string((string *)&local_a40,"first",&local_f83);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_ec0,&local_a40,
             &(data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->tau);
  local_e50 = true;
  std::__cxx11::string::string(local_a60,"tau-first exploration",&local_f84);
  std::__cxx11::string::_M_assign((string *)(local_ec0 + 0x30));
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar3,(typed_option<unsigned_long> *)local_ec0);
  std::__cxx11::string::string((string *)&local_a80,"epsilon",&local_f85);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_8e8,&local_a80,
             &(data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->epsilon
            );
  local_878 = true;
  std::__cxx11::string::string(local_aa0,"epsilon-greedy exploration",&local_f86);
  std::__cxx11::string::_M_assign((string *)(local_8e8 + 0x30));
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                     (poVar3,(typed_option<float> *)local_8e8);
  std::__cxx11::string::string((string *)&local_ac0,"bag",&local_f87);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_988,&local_ac0,
             &(data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->
              bag_size);
  local_918 = true;
  std::__cxx11::string::string(local_ae0,"bagging-based exploration",&local_f88);
  std::__cxx11::string::_M_assign((string *)(local_988 + 0x30));
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar3,(typed_option<unsigned_long> *)local_988);
  std::__cxx11::string::string((string *)&local_b00,"cover",&local_f89);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_3e8,&local_b00,
             &(data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->
              cover_size);
  local_378 = true;
  std::__cxx11::string::string(local_b20,"Online cover based exploration",&local_f8a);
  std::__cxx11::string::_M_assign((string *)(local_3e8 + 0x30));
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar3,(typed_option<unsigned_long> *)local_3e8);
  std::__cxx11::string::string((string *)&local_b40,"psi",&local_f8b);
  VW::config::typed_option<float>::typed_option
            (&local_c8,&local_b40,
             &(data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->psi);
  local_c8.super_base_option.m_keep = true;
  ptVar4 = VW::config::typed_option<float>::default_value(&local_c8,1.0);
  std::__cxx11::string::string(local_b60,"disagreement parameter for cover",&local_f8c);
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar3,ptVar4)
  ;
  std::__cxx11::string::string((string *)&local_b80,"nounif",&local_f8d);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_488,&local_b80,
             &(data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->nounif)
  ;
  local_418 = true;
  std::__cxx11::string::string
            (local_ba0,"do not explore uniformly on zero-probability actions in cover",&local_f8e);
  std::__cxx11::string::_M_assign((string *)(local_488 + 0x30));
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar3,(typed_option<bool> *)local_488);
  std::__cxx11::string::string((string *)&local_bc0,"softmax",&local_f8f);
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_528,&local_bc0,&softmax);
  local_4b8 = true;
  std::__cxx11::string::string(local_be0,"softmax exploration",&local_f90);
  std::__cxx11::string::_M_assign((string *)(local_528 + 0x30));
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar3,(typed_option<bool> *)local_528);
  std::__cxx11::string::string((string *)&local_c00,"regcb",&local_f91);
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_5c8,&local_c00,&regcb);
  local_558 = true;
  std::__cxx11::string::string(local_c20,"RegCB-elim exploration",&local_f92);
  std::__cxx11::string::_M_assign((string *)(local_5c8 + 0x30));
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar3,(typed_option<bool> *)local_5c8);
  std::__cxx11::string::string((string *)&local_c40,"regcbopt",&local_f93);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_668,&local_c40,
             &(data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->
              regcbopt);
  local_5f8 = true;
  std::__cxx11::string::string(local_c60,"RegCB optimistic exploration",&local_f94);
  std::__cxx11::string::_M_assign((string *)(local_668 + 0x30));
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar3,(typed_option<bool> *)local_668);
  std::__cxx11::string::string((string *)&local_c80,"mellowness",&local_f95);
  VW::config::typed_option<float>::typed_option
            (&local_168,&local_c80,
             &(data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->c0);
  local_168.super_base_option.m_keep = true;
  ptVar4 = VW::config::typed_option<float>::default_value(&local_168,0.1);
  std::__cxx11::string::string(local_ca0,"RegCB mellowness parameter c_0. Default 0.1",&local_f96);
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar3,ptVar4)
  ;
  std::__cxx11::string::string((string *)&local_cc0,"greedify",&local_f97);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_708,&local_cc0,
             &(data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->
              greedify);
  local_698 = true;
  std::__cxx11::string::string(local_ce0,"always update first policy once in bagging",&local_f98);
  std::__cxx11::string::_M_assign((string *)(local_708 + 0x30));
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar3,(typed_option<bool> *)local_708);
  std::__cxx11::string::string((string *)&local_d00,"cb_min_cost",&local_f99);
  VW::config::typed_option<float>::typed_option
            (&local_208,&local_d00,
             &(data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->
              min_cb_cost);
  local_208.super_base_option.m_keep = true;
  ptVar4 = VW::config::typed_option<float>::default_value(&local_208,0.0);
  std::__cxx11::string::string(local_d20,"lower bound on cost",&local_f9a);
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar3,ptVar4)
  ;
  std::__cxx11::string::string((string *)&local_d40,"cb_max_cost",&local_f9b);
  VW::config::typed_option<float>::typed_option
            (&local_2a8,&local_d40,
             &(data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->
              max_cb_cost);
  local_2a8.super_base_option.m_keep = true;
  ptVar4 = VW::config::typed_option<float>::default_value(&local_2a8,1.0);
  std::__cxx11::string::string(local_d60,"upper bound on cost",&local_f9c);
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar3,ptVar4)
  ;
  std::__cxx11::string::string((string *)&local_d80,"first_only",&local_f9d);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_7a8,&local_d80,
             &(data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->
              first_only);
  local_738 = true;
  std::__cxx11::string::string
            (local_da0,"Only explore the first action in a tie-breaking event",&local_f9e);
  std::__cxx11::string::_M_assign((string *)(local_7a8 + 0x30));
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar3,(typed_option<bool> *)local_7a8);
  std::__cxx11::string::string((string *)&local_dc0,"lambda",&local_f9f);
  VW::config::typed_option<float>::typed_option
            (&local_348,&local_dc0,
             &(data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->lambda)
  ;
  local_348.super_base_option.m_keep = true;
  ptVar4 = VW::config::typed_option<float>::default_value(&local_348,-1.0);
  std::__cxx11::string::string(local_de0,"parameter for softmax",&local_fa0);
  std::__cxx11::string::_M_assign((string *)&(ptVar4->super_base_option).m_help);
  poVar3 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar3,ptVar4)
  ;
  std::__cxx11::string::string((string *)&local_e00,"cb_type",&local_fa1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_848,&local_e00,&type_string);
  local_7d8 = true;
  std::__cxx11::string::string
            (local_e20,"contextual bandit method to use in {ips,dr,mtr}. Default: mtr",&local_fa2);
  std::__cxx11::string::_M_assign((string *)(local_848 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (poVar3,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_848);
  std::__cxx11::string::~string(local_e20);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_848);
  std::__cxx11::string::~string((string *)&local_e00);
  std::__cxx11::string::~string(local_de0);
  VW::config::typed_option<float>::~typed_option(&local_348);
  std::__cxx11::string::~string((string *)&local_dc0);
  std::__cxx11::string::~string(local_da0);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_7a8);
  std::__cxx11::string::~string((string *)&local_d80);
  std::__cxx11::string::~string(local_d60);
  VW::config::typed_option<float>::~typed_option(&local_2a8);
  std::__cxx11::string::~string((string *)&local_d40);
  std::__cxx11::string::~string(local_d20);
  VW::config::typed_option<float>::~typed_option(&local_208);
  std::__cxx11::string::~string((string *)&local_d00);
  std::__cxx11::string::~string(local_ce0);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_708);
  std::__cxx11::string::~string((string *)&local_cc0);
  std::__cxx11::string::~string(local_ca0);
  VW::config::typed_option<float>::~typed_option(&local_168);
  std::__cxx11::string::~string((string *)&local_c80);
  std::__cxx11::string::~string(local_c60);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_668);
  std::__cxx11::string::~string((string *)&local_c40);
  std::__cxx11::string::~string(local_c20);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_5c8);
  std::__cxx11::string::~string((string *)&local_c00);
  std::__cxx11::string::~string(local_be0);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_528);
  std::__cxx11::string::~string((string *)&local_bc0);
  std::__cxx11::string::~string(local_ba0);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_488);
  std::__cxx11::string::~string((string *)&local_b80);
  std::__cxx11::string::~string(local_b60);
  VW::config::typed_option<float>::~typed_option(&local_c8);
  std::__cxx11::string::~string((string *)&local_b40);
  std::__cxx11::string::~string(local_b20);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_3e8);
  std::__cxx11::string::~string((string *)&local_b00);
  std::__cxx11::string::~string(local_ae0);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_988);
  std::__cxx11::string::~string((string *)&local_ac0);
  std::__cxx11::string::~string(local_aa0);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)local_8e8);
  std::__cxx11::string::~string((string *)&local_a80);
  std::__cxx11::string::~string(local_a60);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_ec0);
  std::__cxx11::string::~string((string *)&local_a40);
  std::__cxx11::string::~string(local_a20);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_f80);
  std::__cxx11::string::~string((string *)&local_a00);
  (**options->_vptr_options_i)(options,&new_options);
  if (cb_explore_adf_option == false) {
    plVar7 = (learner<CB_EXPLORE_ADF::cb_explore_adf,_std::vector<example_*,_std::allocator<example_*>_>_>
              *)0x0;
    goto LAB_002206fe;
  }
  std::__cxx11::string::string((string *)local_f80,"cb_type",(allocator *)local_ec0);
  iVar2 = (*options->_vptr_options_i[1])(options,local_f80);
  std::__cxx11::string::~string((string *)local_f80);
  if ((char)iVar2 == '\0') {
    std::__cxx11::string::string((string *)local_f80,"cb_type",(allocator *)local_ec0);
    (*options->_vptr_options_i[5])(options,local_f80,&type_string);
    std::__cxx11::string::~string((string *)local_f80);
    (**options->_vptr_options_i)(options,&new_options);
  }
  (data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
   super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->all = all;
  if (0.0 < (data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
             super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
             super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->lambda) {
    (data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->lambda =
         -(data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
           super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
           super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->lambda;
  }
  std::__cxx11::string::string((string *)local_f80,"cb_adf",(allocator *)local_ec0);
  iVar2 = (*options->_vptr_options_i[1])(options,local_f80);
  std::__cxx11::string::~string((string *)local_f80);
  if ((char)iVar2 == '\0') {
    std::__cxx11::string::string((string *)local_f80,"cb_adf",(allocator *)local_8e8);
    std::__cxx11::string::string((string *)local_ec0,"",(allocator *)local_988);
    (*options->_vptr_options_i[5])(options,local_f80,local_ec0);
    std::__cxx11::string::~string((string *)local_ec0);
    std::__cxx11::string::~string((string *)local_f80);
  }
  all->delete_prediction = ACTION_SCORE::delete_action_scores;
  std::__cxx11::string::string((string *)local_f80,"cover",(allocator *)local_ec0);
  iVar2 = (*options->_vptr_options_i[1])(options,local_f80);
  std::__cxx11::string::~string((string *)local_f80);
  if ((char)iVar2 == '\0') {
    std::__cxx11::string::string((string *)local_f80,"bag",(allocator *)local_ec0);
    iVar2 = (*options->_vptr_options_i[1])(options,local_f80);
    std::__cxx11::string::~string((string *)local_f80);
    if ((char)iVar2 == '\0') {
      std::__cxx11::string::string((string *)local_f80,"first",(allocator *)local_ec0);
      iVar2 = (*options->_vptr_options_i[1])(options,local_f80);
      std::__cxx11::string::~string((string *)local_f80);
      ws = 1;
      if ((char)iVar2 == '\0') {
        if (softmax == true) {
          (data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
           super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
           super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->
          explore_type = 3;
        }
        else if (regcb == false) {
          std::__cxx11::string::string((string *)local_f80,"regcbopt",(allocator *)local_ec0);
          iVar2 = (*options->_vptr_options_i[1])(options,local_f80);
          if ((char)iVar2 == '\0') {
            std::__cxx11::string::~string((string *)local_f80);
          }
          else {
            bVar1 = (data._M_t.
                     super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
                     super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
                     super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->
                    regcbopt;
            std::__cxx11::string::~string((string *)local_f80);
            if (bVar1 == true) goto LAB_002203c7;
          }
          std::__cxx11::string::string((string *)local_f80,"epsilon",(allocator *)local_ec0);
          iVar2 = (*options->_vptr_options_i[1])(options,local_f80);
          std::__cxx11::string::~string((string *)local_f80);
          if ((char)iVar2 == '\0') {
            (data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
             super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
             super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->epsilon =
                 0.05;
          }
          (data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
           super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
           super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->
          explore_type = 1;
        }
        else {
LAB_002203c7:
          (data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
           super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
           super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->
          explore_type = 5;
        }
      }
      else {
        (data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->explore_type
             = 0;
      }
    }
    else {
      (data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
       super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->explore_type =
           2;
      ws = (data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
            super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
            super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->bag_size;
    }
  }
  else {
    (data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->explore_type = 4;
    ws = (data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
          super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
          super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->cover_size +
         1;
  }
  ((data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
    super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->gen_cs).cb_type =
       2;
  std::__cxx11::string::string((string *)local_f80,"cb_type",(allocator *)local_ec0);
  iVar2 = (*options->_vptr_options_i[1])(options,local_f80);
  std::__cxx11::string::~string((string *)local_f80);
  if ((char)iVar2 != '\0') {
    iVar2 = std::__cxx11::string::compare((char *)&type_string);
    if (iVar2 == 0) {
      ((data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
        super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
        super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->gen_cs).
      cb_type = 0;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&type_string);
      if (iVar2 == 0) {
        ((data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
          super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
          super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->gen_cs).
        cb_type = 2;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&type_string);
        if (iVar2 == 0) {
          std::__cxx11::string::string((string *)local_f80,"cover",(allocator *)local_ec0);
          iVar2 = (*options->_vptr_options_i[1])(options,local_f80);
          std::__cxx11::string::~string((string *)local_f80);
          if ((char)iVar2 != '\0') {
            poVar5 = std::operator<<(&(all->trace_message).super_ostream,
                                     "warning: currently, mtr is only used for the first policy in cover, other policies use dr"
                                    );
            std::endl<char,std::char_traits<char>>(poVar5);
          }
          ((data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
            super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
            super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->gen_cs).
          cb_type = 3;
        }
        else {
          poVar5 = std::operator<<(&(all->trace_message).super_ostream,
                                   "warning: cb_type must be in {\'ips\',\'dr\',\'mtr\'}; resetting to mtr."
                                  );
          std::endl<char,std::char_traits<char>>(poVar5);
          std::__cxx11::string::string((string *)local_f80,"cb_type",(allocator *)local_8e8);
          std::__cxx11::string::string((string *)local_ec0,"mtr",(allocator *)local_988);
          (*options->_vptr_options_i[6])(options,local_f80,local_ec0);
          std::__cxx11::string::~string((string *)local_ec0);
          std::__cxx11::string::~string((string *)local_f80);
        }
      }
    }
    if (((data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
          super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
          super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->explore_type
         == 5) &&
       (((data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
          super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
          super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->gen_cs).
        cb_type != 3)) {
      poVar5 = std::operator<<(&(all->trace_message).super_ostream,
                               "warning: bad cb_type, RegCB only supports mtr!");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
  }
  l = setup_base(options,all);
  base = LEARNER::as_multiline<char,char>(l);
  ppuVar9 = &CB::cb_label;
  plVar10 = &all->p->lp;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    plVar10->default_label = (_func_void_void_ptr *)*ppuVar9;
    ppuVar9 = ppuVar9 + (ulong)bVar11 * -2 + 1;
    plVar10 = (label_parser *)((long)plVar10 + (ulong)bVar11 * -0x10 + 8);
  }
  all->label_type = cb;
  ((data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
    super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->gen_cs).scorer =
       all->scorer;
  pmVar6 = LEARNER::as_multiline<char,char>(all->cost_sensitive);
  (data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
   super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl)->cs_ldf_learner =
       pmVar6;
  plVar7 = LEARNER::
           learner<CB_EXPLORE_ADF::cb_explore_adf,std::vector<example*,std::allocator<example*>>>::
           init_learner<LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                     (data._M_t.
                      super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
                      super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
                      super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl,
                      base,CB_EXPLORE_ADF::do_actual_learning<true>,
                      CB_EXPLORE_ADF::do_actual_learning<false>,ws,action_probs);
  data._M_t.super___uniq_ptr_impl<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_void_(*)(void_*)>.
  super__Head_base<0UL,_CB_EXPLORE_ADF::cb_explore_adf_*,_false>._M_head_impl =
       (cb_explore_adf *)0x0;
  *(undefined8 *)(plVar7 + 0x58) = *(undefined8 *)(plVar7 + 0x18);
  *(code **)(plVar7 + 0x68) = CB_EXPLORE_ADF::finish_multiline_example;
  *(undefined8 *)(plVar7 + 0xb8) = *(undefined8 *)(plVar7 + 0x18);
  *(undefined8 *)(plVar7 + 0xc0) = *(undefined8 *)(plVar7 + 0x20);
  *(code **)(plVar7 + 200) = CB_EXPLORE_ADF::finish;
LAB_002206fe:
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::__cxx11::string::~string((string *)&type_string);
  std::unique_ptr<CB_EXPLORE_ADF::cb_explore_adf,_void_(*)(void_*)>::~unique_ptr(&data);
  return (base_learner *)plVar7;
}

Assistant:

base_learner* cb_explore_adf_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<cb_explore_adf>();
  bool cb_explore_adf_option = false;
  bool softmax = false;
  bool regcb = false;
  std::string type_string = "mtr";
  option_group_definition new_options("Contextual Bandit Exploration with Action Dependent Features");
  new_options
      .add(make_option("cb_explore_adf", cb_explore_adf_option)
               .keep()
               .help("Online explore-exploit for a contextual bandit problem with multiline action dependent features"))
      .add(make_option("first", data->tau).keep().help("tau-first exploration"))
      .add(make_option("epsilon", data->epsilon).keep().help("epsilon-greedy exploration"))
      .add(make_option("bag", data->bag_size).keep().help("bagging-based exploration"))
      .add(make_option("cover", data->cover_size).keep().help("Online cover based exploration"))
      .add(make_option("psi", data->psi).keep().default_value(1.0f).help("disagreement parameter for cover"))
      .add(make_option("nounif", data->nounif)
               .keep()
               .help("do not explore uniformly on zero-probability actions in cover"))
      .add(make_option("softmax", softmax).keep().help("softmax exploration"))
      .add(make_option("regcb", regcb).keep().help("RegCB-elim exploration"))
      .add(make_option("regcbopt", data->regcbopt).keep().help("RegCB optimistic exploration"))
      .add(make_option("mellowness", data->c0)
               .keep()
               .default_value(0.1f)
               .help("RegCB mellowness parameter c_0. Default 0.1"))
      .add(make_option("greedify", data->greedify).keep().help("always update first policy once in bagging"))
      .add(make_option("cb_min_cost", data->min_cb_cost).keep().default_value(0.f).help("lower bound on cost"))
      .add(make_option("cb_max_cost", data->max_cb_cost).keep().default_value(1.f).help("upper bound on cost"))
      .add(make_option("first_only", data->first_only)
               .keep()
               .help("Only explore the first action in a tie-breaking event"))
      .add(make_option("lambda", data->lambda).keep().default_value(-1.f).help("parameter for softmax"))
      .add(make_option("cb_type", type_string)
               .keep()
               .help("contextual bandit method to use in {ips,dr,mtr}. Default: mtr"));
  options.add_and_parse(new_options);

  if (!cb_explore_adf_option)
    return nullptr;

  // Ensure serialization of this option in all cases.
  if (!options.was_supplied("cb_type"))
  {
    options.insert("cb_type", type_string);
    options.add_and_parse(new_options);
  }

  data->all = &all;
  if (data->lambda > 0)  // Lambda should always be negative because we are using a cost basis.
    data->lambda = -data->lambda;

  if (!options.was_supplied("cb_adf"))
  {
    options.insert("cb_adf", "");
  }

  all.delete_prediction = delete_action_scores;

  size_t problem_multiplier = 1;

  if (options.was_supplied("cover"))
  {
    data->explore_type = COVER;
    problem_multiplier = data->cover_size + 1;
  }
  else if (options.was_supplied("bag"))
  {
    data->explore_type = BAG_EXPLORE;
    problem_multiplier = data->bag_size;
  }
  else if (options.was_supplied("first"))
    data->explore_type = EXPLORE_FIRST;
  else if (softmax)
    data->explore_type = SOFTMAX;
  else if (regcb || (options.was_supplied("regcbopt") && data->regcbopt))
    data->explore_type = REGCB;
  else
  {
    if (!options.was_supplied("epsilon"))
      data->epsilon = 0.05f;
    data->explore_type = EPS_GREEDY;
  }

  data->gen_cs.cb_type = CB_TYPE_IPS;
  if (options.was_supplied("cb_type"))
  {
    if (type_string.compare("dr") == 0)
      data->gen_cs.cb_type = CB_TYPE_DR;
    else if (type_string.compare("ips") == 0)
      data->gen_cs.cb_type = CB_TYPE_IPS;
    else if (type_string.compare("mtr") == 0)
    {
      if (options.was_supplied("cover"))
        all.trace_message << "warning: currently, mtr is only used for the first policy in cover, other policies use dr"
                          << endl;
      data->gen_cs.cb_type = CB_TYPE_MTR;
    }
    else
    {
      all.trace_message << "warning: cb_type must be in {'ips','dr','mtr'}; resetting to mtr." << std::endl;
      options.replace("cb_type", "mtr");
    }

    if (data->explore_type == REGCB && data->gen_cs.cb_type != CB_TYPE_MTR)
      all.trace_message << "warning: bad cb_type, RegCB only supports mtr!" << std::endl;
  }

  multi_learner* base = as_multiline(setup_base(options, all));
  all.p->lp = CB::cb_label;
  all.label_type = label_type::cb;

  // Extract from lower level reductions.
  data->gen_cs.scorer = all.scorer;
  data->cs_ldf_learner = as_multiline(all.cost_sensitive);

  learner<cb_explore_adf, multi_ex>& l = init_learner(data, base, CB_EXPLORE_ADF::do_actual_learning<true>,
      CB_EXPLORE_ADF::do_actual_learning<false>, problem_multiplier, prediction_type::action_probs);

  l.set_finish_example(CB_EXPLORE_ADF::finish_multiline_example);
  l.set_finish(CB_EXPLORE_ADF::finish);
  return make_base(l);
}